

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintestlogger.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_a32cc::FixedBufString<1022>::appendScaled<1000>
          (FixedBufString<1022> *this,qreal value,char *unit)

{
  double dVar1;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  ulong uVar6;
  ushort local_12;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = -(ulong)(value < -value);
  if (1.0 <= (double)(~uVar6 & (ulong)value | (ulong)-value & uVar6)) {
    pbVar3 = &DAT_001570d7;
    lVar4 = 1;
    do {
      lVar5 = lVar4;
      lVar4 = lVar5 * 1000;
      pbVar3 = pbVar3 + 1;
    } while ((double)lVar4 < value);
    dVar1 = (double)lVar5;
  }
  else {
    dVar1 = 0.0;
    if (value * 0.0 <= 1000.0) {
      pbVar3 = &(anonymous_namespace)::submultiplePrefixes;
    }
    else {
      lVar4 = 0;
      pbVar3 = &DAT_00157523;
      do {
        dVar1 = 0.0;
        if (lVar4 == -6) goto LAB_00121471;
        lVar4 = lVar4 + -1;
      } while (1000.0 < value * 0.0);
      pbVar3 = &(anonymous_namespace)::submultiplePrefixes + -lVar4;
      dVar1 = 0.0;
    }
  }
LAB_00121471:
  local_12 = (ushort)*pbVar3;
  iVar2 = snprintf((this->buf)._M_elems + this->used,0x3ff - this->used,", %.3g %s%s",value / dVar1,
                   &local_12,unit);
  this->used = this->used + (long)iVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void appendScaled(qreal value, const char *unit)
    {
        char prefix[2] = {};
        qreal v = qAbs(value);
        qint64 ratio;
        if (v < 1 && Power == 1000) {
            const char *prefixes = submultiplePrefixes;
            ratio = qreal(std::atto::num) / qreal(std::atto::den);
            while (value * ratio > 1000 && *prefixes) {
                ++prefixes;
                ratio *= 1000;
            }
            prefix[0] = *prefixes;
        } else {
            const char *prefixes = multiplePrefixes;
            ratio = 1;
            while (value > 1000 * ratio) {  // yes, even for binary
                ++prefixes;
                ratio *= Power;
            }
            prefix[0] = *prefixes;
        }

        // adjust the value by the ratio
        value /= ratio;
        appendf(", %.3g %s%s", value, prefix, unit);
    }